

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::erase(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        *this,key_type *key)

{
  Node *pNVar1;
  uint uVar2;
  InfoType info;
  size_t idx;
  
  idx = 0;
  info = 0;
  Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
  ::keyToIdx<Rml::PropertyId_const&>
            ((Table<true,80ul,Rml::PropertyId,Rml::Property,robin_hood::hash<Rml::PropertyId,void>,std::equal_to<Rml::PropertyId>>
              *)this,key,&idx,&info);
  uVar2 = (uint)this->mInfo[idx];
  pNVar1 = this->mKeyVals + idx;
  while ((info != uVar2 || (*key != (pNVar1->mData).first))) {
    info = info + this->mInfoInc;
    uVar2 = (uint)this->mInfo[idx + 1];
    pNVar1 = pNVar1 + 1;
    idx = idx + 1;
    if (uVar2 < info) {
      return 0;
    }
  }
  shiftDown(this,idx);
  this->mNumElements = this->mNumElements - 1;
  return 1;
}

Assistant:

size_t erase(const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        // check while info matches with the source idx
        do {
            if (info == mInfo[idx] && WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                shiftDown(idx);
                --mNumElements;
                return 1;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found to delete
        return 0;
    }